

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

void __thiscall dg::vr::GraphBuilder::buildBlocks(GraphBuilder *this,Function *function)

{
  bool bVar1;
  VRLocation *in_RSI;
  Function *in_RDI;
  BasicBlock *block;
  const_iterator __end2;
  const_iterator __begin2;
  Function *__range2;
  Instruction *in_stack_ffffffffffffffa8;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  *in_stack_ffffffffffffffb0;
  VRCodeGraph *this_00;
  VRCodeGraph *in_stack_ffffffffffffffd0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_28;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_20 [2];
  VRLocation *local_10;
  
  local_10 = in_RSI;
  local_20[0].NodePtr = (node_pointer)llvm::Function::begin((Function *)in_stack_ffffffffffffffa8);
  local_28.NodePtr = (node_pointer)llvm::Function::end((Function *)in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = llvm::operator!=(local_20,&local_28);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (VRCodeGraph *)
         llvm::
         ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
         ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                      *)0x1bc66f);
    buildBlock((GraphBuilder *)__end2.NodePtr,block);
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
    ::operator++(in_stack_ffffffffffffffb0);
  }
  this_00 = *(VRCodeGraph **)(in_RDI + 8);
  llvm::Function::getEntryBlock((Function *)0x1bc6ba);
  llvm::BasicBlock::front((BasicBlock *)0x1bc6c2);
  VRCodeGraph::getVRLocation(this_00,in_stack_ffffffffffffffa8);
  VRCodeGraph::setEntryLocation(in_stack_ffffffffffffffd0,in_RDI,local_10);
  return;
}

Assistant:

void GraphBuilder::buildBlocks(const llvm::Function &function) {
    for (const llvm::BasicBlock &block : function) {
        assert(!block.empty());
        buildBlock(block);
    }

    codeGraph.setEntryLocation(
            &function,
            codeGraph.getVRLocation(&function.getEntryBlock().front()));
}